

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinExport::WriteBinaryLight(AssbinExport *this,IOStream *container,aiLight *l)

{
  uint local_68 [4];
  undefined1 local_58 [8];
  AssbinChunkWriter chunk;
  aiLight *l_local;
  IOStream *container_local;
  AssbinExport *this_local;
  
  chunk.initial = (size_t)l;
  AssbinChunkWriter::AssbinChunkWriter((AssbinChunkWriter *)local_58,container,0x1235,0x1000);
  Write<aiString>((IOStream *)local_58,(aiString *)chunk.initial);
  local_68[0] = *(uint *)(chunk.initial + 0x404);
  Write<unsigned_int>((IOStream *)local_58,local_68);
  if (*(int *)(chunk.initial + 0x404) != 1) {
    Write<float>((IOStream *)local_58,(float *)(chunk.initial + 0x42c));
    Write<float>((IOStream *)local_58,(float *)(chunk.initial + 0x430));
    Write<float>((IOStream *)local_58,(float *)(chunk.initial + 0x434));
  }
  Write<aiColor3D>((IOStream *)local_58,(aiColor3D *)(chunk.initial + 0x438));
  Write<aiColor3D>((IOStream *)local_58,(aiColor3D *)(chunk.initial + 0x444));
  Write<aiColor3D>((IOStream *)local_58,(aiColor3D *)(chunk.initial + 0x450));
  if (*(int *)(chunk.initial + 0x404) == 3) {
    Write<float>((IOStream *)local_58,(float *)(chunk.initial + 0x45c));
    Write<float>((IOStream *)local_58,(float *)(chunk.initial + 0x460));
  }
  AssbinChunkWriter::~AssbinChunkWriter((AssbinChunkWriter *)local_58);
  return;
}

Assistant:

void WriteBinaryLight( IOStream * container, const aiLight* l )
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AILIGHT );

        Write<aiString>(&chunk,l->mName);
        Write<unsigned int>(&chunk,l->mType);

        if (l->mType != aiLightSource_DIRECTIONAL) {
            Write<float>(&chunk,l->mAttenuationConstant);
            Write<float>(&chunk,l->mAttenuationLinear);
            Write<float>(&chunk,l->mAttenuationQuadratic);
        }

        Write<aiColor3D>(&chunk,l->mColorDiffuse);
        Write<aiColor3D>(&chunk,l->mColorSpecular);
        Write<aiColor3D>(&chunk,l->mColorAmbient);

        if (l->mType == aiLightSource_SPOT) {
            Write<float>(&chunk,l->mAngleInnerCone);
            Write<float>(&chunk,l->mAngleOuterCone);
        }

    }